

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2aTextureFilteringTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles2::Accuracy::Texture2DFilteringCase::iterate(Texture2DFilteringCase *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  TestLog *log;
  Texture2D *pTVar3;
  pointer ppTVar4;
  RenderContext *context;
  TestContext *this_00;
  int iVar5;
  deUint32 seed;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  NotSupportedError *this_01;
  int width;
  uint height;
  Texture2D *format;
  uint width_00;
  int height_00;
  bool bVar7;
  float extraout_XMM0_Db;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  RandomViewport viewport;
  vector<float,_std::allocator<float>_> texCoord;
  int score;
  float fStack_194;
  ConstPixelBufferAccess *local_190;
  TextureRenderer *local_188;
  undefined1 local_180 [32];
  int local_160;
  anon_union_16_3_1194ccdc_for_v local_15c;
  bool local_14c;
  undefined3 uStack_14b;
  DepthStencilMode DStack_148;
  Surface referenceFrame;
  Surface renderedFrame;
  undefined1 local_104 [76];
  size_type sStack_b8;
  size_type local_b0;
  int aiStack_a8 [2];
  int local_a0;
  anon_union_16_3_1194ccdc_for_v local_9c;
  bool local_8c;
  undefined3 uStack_8b;
  DepthStencilMode DStack_88;
  LodMode local_84;
  TextureFormatInfo fmtInfo;
  long lVar6;
  
  iVar5 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar5);
  log = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  iVar5 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  seed = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,(RenderTarget *)CONCAT44(extraout_var_00,iVar5),0x100,0x100,seed);
  tcu::Surface::Surface(&renderedFrame,viewport.width,viewport.height);
  tcu::Surface::Surface(&referenceFrame,viewport.width,viewport.height);
  format = &(*(this->m_textures).
              super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
              super__Vector_impl_data._M_start)->m_refTexture;
  tcu::getTextureFormatInfo(&fmtInfo,(TextureFormat *)format);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_104,TEXTURETYPE_2D);
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if ((0xff < viewport.width) && (0xff < viewport.height)) {
    (**(code **)(lVar6 + 8))(0x84c0);
    (**(code **)(lVar6 + 0xb8))
              (0xde1,(*(this->m_textures).
                       super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>.
                       _M_impl.super__Vector_impl_data._M_start)->m_glTexture);
    (**(code **)(lVar6 + 0x1360))(0xde1,0x2802,this->m_wrapS);
    (**(code **)(lVar6 + 0x1360))(0xde1,0x2803,this->m_wrapT);
    (**(code **)(lVar6 + 0x1360))(0xde1,0x2801,this->m_minFilter);
    (**(code **)(lVar6 + 0x1360))(0xde1,0x2800,this->m_magFilter);
    glu::mapGLSampler((Sampler *)local_180,this->m_wrapS,this->m_wrapT,this->m_minFilter,
                      this->m_magFilter);
    local_a0 = local_160;
    local_b0 = local_180._16_8_;
    aiStack_a8[0] = local_180._24_4_;
    aiStack_a8[1] = local_180._28_4_;
    local_104._68_8_ = local_180._0_8_;
    sStack_b8 = local_180._8_8_;
    local_9c._0_8_ = local_15c._0_8_;
    local_9c._8_8_ = local_15c._8_8_;
    local_8c = local_14c;
    uStack_8b = uStack_14b;
    DStack_88 = DStack_148;
    local_104._4_4_ =
         glu::TextureTestUtil::getSamplerType((format->super_TextureLevelPyramid).m_format);
    width_00 = (uint)viewport.width >> 1;
    local_84 = LODMODE_EXACT;
    height = (uint)viewport.height >> 1;
    local_104._52_4_ = fmtInfo.lookupBias.m_data[0];
    local_104._56_4_ = fmtInfo.lookupBias.m_data[1];
    local_104._60_4_ = fmtInfo.lookupBias.m_data[2];
    local_104._64_4_ = fmtInfo.lookupBias.m_data[3];
    local_104._36_4_ = fmtInfo.lookupScale.m_data[0];
    local_104._40_4_ = fmtInfo.lookupScale.m_data[1];
    local_104._44_4_ = fmtInfo.lookupScale.m_data[2];
    local_104._48_4_ = fmtInfo.lookupScale.m_data[3];
    (**(code **)(lVar6 + 0x1a00))(viewport.x,viewport.y,width_00,height);
    local_180._0_4_ = 0xc0800000;
    local_180._4_4_ = 0xc0900000;
    score = 0x40800000;
    fStack_194 = 2.5;
    glu::TextureTestUtil::computeQuadTexCoord2D(&texCoord,(Vec2 *)local_180,(Vec2 *)&score);
    local_188 = &this->m_renderer;
    deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
              (local_188,0,
               texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,(RenderParams *)local_104);
    iVar5 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    tcu::SurfaceAccess::SurfaceAccess
              ((SurfaceAccess *)local_180,&referenceFrame,
               (PixelFormat *)(CONCAT44(extraout_var_01,iVar5) + 8),0,0,width_00,height);
    pTVar3 = *(this->m_textures).
              super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_190 = (pTVar3->m_refTexture).m_view.m_levels;
    score = (pTVar3->m_refTexture).m_view.m_numLevels;
    glu::TextureTestUtil::sampleTexture
              ((SurfaceAccess *)local_180,(Texture2DView *)&score,
               texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,(ReferenceParams *)local_104);
    width = viewport.width - width_00;
    (**(code **)(lVar6 + 0x1a00))(viewport.x + width_00,viewport.y,width,height);
    local_180._0_4_ = 0xbf000000;
    local_180._4_4_ = 0x3f400000;
    score = 0x3e800000;
    fStack_194 = 1.25;
    glu::TextureTestUtil::computeQuadTexCoord2D(&texCoord,(Vec2 *)local_180,(Vec2 *)&score);
    deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
              (local_188,0,
               texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,(RenderParams *)local_104);
    iVar5 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    tcu::SurfaceAccess::SurfaceAccess
              ((SurfaceAccess *)local_180,&referenceFrame,
               (PixelFormat *)(CONCAT44(extraout_var_02,iVar5) + 8),width_00,0,width,height);
    pTVar3 = *(this->m_textures).
              super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_190 = (pTVar3->m_refTexture).m_view.m_levels;
    score = (pTVar3->m_refTexture).m_view.m_numLevels;
    glu::TextureTestUtil::sampleTexture
              ((SurfaceAccess *)local_180,(Texture2DView *)&score,
               texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,(ReferenceParams *)local_104);
    ppTVar4 = (this->m_textures).
              super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    bVar7 = 8 < (ulong)((long)(this->m_textures).
                              super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar4);
    fVar10 = fmtInfo.lookupBias.m_data[1];
    if (bVar7) {
      (**(code **)(lVar6 + 0xb8))(0xde1,ppTVar4[1]->m_glTexture);
      (**(code **)(lVar6 + 0x1360))(0xde1,0x2802,this->m_wrapS);
      (**(code **)(lVar6 + 0x1360))(0xde1,0x2803,this->m_wrapT);
      (**(code **)(lVar6 + 0x1360))(0xde1,0x2801,this->m_minFilter);
      (**(code **)(lVar6 + 0x1360))(0xde1,0x2800,this->m_magFilter);
      fVar10 = fmtInfo.lookupBias.m_data[1];
    }
    height_00 = viewport.height - height;
    (**(code **)(lVar6 + 0x1a00))(viewport.x,viewport.y + height,width_00,height_00);
    pTVar3 = (this->m_textures).
             super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
             super__Vector_impl_data._M_start[bVar7];
    local_180._0_4_ = 0xbf000000;
    local_180._4_4_ = 0xbe4ccccd;
    auVar8._0_4_ = (float)width_00 * 1.2;
    auVar8._4_4_ = (float)height_00 * 1.1;
    auVar8._8_4_ = extraout_XMM0_Db * 0.0;
    auVar8._12_4_ = fVar10 * 0.0;
    uVar1 = (pTVar3->m_refTexture).m_width;
    uVar2 = (pTVar3->m_refTexture).m_height;
    auVar9._4_4_ = (float)(int)uVar2;
    auVar9._0_4_ = (float)(int)uVar1;
    auVar9._8_8_ = 0;
    auVar9 = divps(auVar8,auVar9);
    score = (int)(auVar9._0_4_ + -0.5);
    fStack_194 = auVar9._4_4_ + -0.2;
    glu::TextureTestUtil::computeQuadTexCoord2D(&texCoord,(Vec2 *)local_180,(Vec2 *)&score);
    deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
              (local_188,0,
               texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,(RenderParams *)local_104);
    iVar5 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    tcu::SurfaceAccess::SurfaceAccess
              ((SurfaceAccess *)local_180,&referenceFrame,
               (PixelFormat *)(CONCAT44(extraout_var_03,iVar5) + 8),0,height,width_00,height_00);
    pTVar3 = (this->m_textures).
             super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
             super__Vector_impl_data._M_start[bVar7];
    local_190 = (pTVar3->m_refTexture).m_view.m_levels;
    score = (pTVar3->m_refTexture).m_view.m_numLevels;
    glu::TextureTestUtil::sampleTexture
              ((SurfaceAccess *)local_180,(Texture2DView *)&score,
               texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,(ReferenceParams *)local_104);
    (**(code **)(lVar6 + 0x1a00))(viewport.x + width_00,viewport.y + height,width,height_00);
    local_180._0_4_ = 0xbf000000;
    local_180._4_4_ = 0x3f400000;
    score = 0x3e800000;
    fStack_194 = 1.25;
    glu::TextureTestUtil::computeQuadTexCoord2D(&texCoord,(Vec2 *)local_180,(Vec2 *)&score);
    deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
              (local_188,0,
               texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,(RenderParams *)local_104);
    iVar5 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    tcu::SurfaceAccess::SurfaceAccess
              ((SurfaceAccess *)local_180,&referenceFrame,
               (PixelFormat *)(CONCAT44(extraout_var_04,iVar5) + 8),width_00,height,width,height_00)
    ;
    pTVar3 = (this->m_textures).
             super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
             super__Vector_impl_data._M_start[bVar7];
    local_190 = (pTVar3->m_refTexture).m_view.m_levels;
    score = (pTVar3->m_refTexture).m_view.m_numLevels;
    glu::TextureTestUtil::sampleTexture
              ((SurfaceAccess *)local_180,(Texture2DView *)&score,
               texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,(ReferenceParams *)local_104);
    context = this->m_renderCtx;
    tcu::Surface::getAccess((PixelBufferAccess *)local_180,&renderedFrame);
    glu::readPixels(context,viewport.x,viewport.y,(PixelBufferAccess *)local_180);
    score = glu::TextureTestUtil::measureAccuracy(log,&referenceFrame,&renderedFrame,0x10,0xc80);
    this_00 = (this->super_TestCase).super_TestNode.m_testCtx;
    de::toString<int>((string *)local_180,&score);
    tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,(char *)local_180._0_8_);
    std::__cxx11::string::~string((string *)local_180);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&texCoord.super__Vector_base<float,_std::allocator<float>_>);
    tcu::Surface::~Surface(&referenceFrame);
    tcu::Surface::~Surface(&renderedFrame);
    return STOP;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_01,"Too small viewport",glcts::fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/accuracy/es2aTextureFilteringTests.cpp"
             ,0xd2);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

Texture2DFilteringCase::IterateResult Texture2DFilteringCase::iterate (void)
{
	const glw::Functions&		gl					= m_renderCtx.getFunctions();
	TestLog&					log					= m_testCtx.getLog();
	const int					defViewportWidth	= 256;
	const int					defViewportHeight	= 256;
	RandomViewport				viewport			(m_renderCtx.getRenderTarget(), defViewportWidth, defViewportHeight, deStringHash(getName()));
	tcu::Surface				renderedFrame		(viewport.width, viewport.height);
	tcu::Surface				referenceFrame		(viewport.width, viewport.height);
	const tcu::TextureFormat&	texFmt				= m_textures[0]->getRefTexture().getFormat();
	tcu::TextureFormatInfo		fmtInfo				= tcu::getTextureFormatInfo(texFmt);
	ReferenceParams				refParams			(TEXTURETYPE_2D);
	vector<float>				texCoord;

	// Accuracy measurements are off unless viewport size is 256x256
	if (viewport.width < defViewportWidth || viewport.height < defViewportHeight)
		throw tcu::NotSupportedError("Too small viewport", "", __FILE__, __LINE__);

	// Viewport is divided into 4 sections.
	int				leftWidth			= viewport.width / 2;
	int				rightWidth			= viewport.width - leftWidth;
	int				bottomHeight		= viewport.height / 2;
	int				topHeight			= viewport.height - bottomHeight;

	int				curTexNdx			= 0;

	// Use unit 0.
	gl.activeTexture(GL_TEXTURE0);

	// Bind gradient texture and setup sampler parameters.
	gl.bindTexture(GL_TEXTURE_2D, m_textures[curTexNdx]->getGLTexture());
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		m_wrapS);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		m_wrapT);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	m_magFilter);

	// Setup params for reference.
	refParams.sampler		= mapGLSampler(m_wrapS, m_wrapT, m_minFilter, m_magFilter);
	refParams.samplerType	= getSamplerType(texFmt);
	refParams.lodMode		= LODMODE_EXACT;
	refParams.colorBias		= fmtInfo.lookupBias;
	refParams.colorScale	= fmtInfo.lookupScale;

	// Bottom left: Minification
	{
		gl.viewport(viewport.x, viewport.y, leftWidth, bottomHeight);

		computeQuadTexCoord2D(texCoord, tcu::Vec2(-4.0f, -4.5f), tcu::Vec2(4.0f, 2.5f));

		m_renderer.renderQuad(0, &texCoord[0], refParams);
		sampleTexture(tcu::SurfaceAccess(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat(), 0, 0, leftWidth, bottomHeight),
					  m_textures[curTexNdx]->getRefTexture(), &texCoord[0], refParams);
	}

	// Bottom right: Magnification
	{
		gl.viewport(viewport.x+leftWidth, viewport.y, rightWidth, bottomHeight);

		computeQuadTexCoord2D(texCoord, tcu::Vec2(-0.5f, 0.75f), tcu::Vec2(0.25f, 1.25f));

		m_renderer.renderQuad(0, &texCoord[0], refParams);
		sampleTexture(tcu::SurfaceAccess(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat(), leftWidth, 0, rightWidth, bottomHeight),
					  m_textures[curTexNdx]->getRefTexture(), &texCoord[0], refParams);
	}

	if (m_textures.size() >= 2)
	{
		curTexNdx += 1;

		// Setup second texture.
		gl.bindTexture(GL_TEXTURE_2D, m_textures[curTexNdx]->getGLTexture());
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		m_wrapS);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		m_wrapT);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	m_minFilter);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	m_magFilter);
	}

	// Top left: Minification
	// \note Minification is chosen so that 0.0 < lod <= 0.5. This way special minification threshold rule will be triggered.
	{
		gl.viewport(viewport.x, viewport.y+bottomHeight, leftWidth, topHeight);

		float	sMin		= -0.5f;
		float	tMin		= -0.2f;
		float	sRange		= ((float)leftWidth * 1.2f) / (float)m_textures[curTexNdx]->getRefTexture().getWidth();
		float	tRange		= ((float)topHeight * 1.1f) / (float)m_textures[curTexNdx]->getRefTexture().getHeight();

		computeQuadTexCoord2D(texCoord, tcu::Vec2(sMin, tMin), tcu::Vec2(sMin+sRange, tMin+tRange));

		m_renderer.renderQuad(0, &texCoord[0], refParams);
		sampleTexture(tcu::SurfaceAccess(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat(), 0, bottomHeight, leftWidth, topHeight),
					  m_textures[curTexNdx]->getRefTexture(), &texCoord[0], refParams);
	}

	// Top right: Magnification
	{
		gl.viewport(viewport.x+leftWidth, viewport.y+bottomHeight, rightWidth, topHeight);

		computeQuadTexCoord2D(texCoord, tcu::Vec2(-0.5f, 0.75f), tcu::Vec2(0.25f, 1.25f));

		m_renderer.renderQuad(0, &texCoord[0], refParams);
		sampleTexture(tcu::SurfaceAccess(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat(), leftWidth, bottomHeight, rightWidth, topHeight),
					  m_textures[curTexNdx]->getRefTexture(), &texCoord[0], refParams);
	}

	// Read result.
	glu::readPixels(m_renderCtx, viewport.x, viewport.y, renderedFrame.getAccess());

	// Compare and log.
	{
		DE_ASSERT(getNodeType() == tcu::NODETYPE_ACCURACY);

		const int	bestScoreDiff	= 16;
		const int	worstScoreDiff	= 3200;

		int score = measureAccuracy(log, referenceFrame, renderedFrame, bestScoreDiff, worstScoreDiff);
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::toString(score).c_str());
	}

	return STOP;
}